

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

void nn_check_requires(nn_parse_context *ctx)

{
  nn_option *pnVar1;
  nn_option *opt;
  int i;
  nn_parse_context *ctx_local;
  
  opt._4_4_ = 0;
  while (pnVar1 = ctx->options + opt._4_4_, pnVar1->longname != (char *)0x0) {
    if (((ctx->last_option_usage[opt._4_4_] != (char *)0x0) && (pnVar1->requires_mask != 0)) &&
       ((pnVar1->requires_mask & ctx->mask) != pnVar1->requires_mask)) {
      nn_option_requires(ctx,opt._4_4_);
    }
    opt._4_4_ = opt._4_4_ + 1;
  }
  if ((ctx->requires & ctx->mask) == ctx->requires) {
    return;
  }
  fprintf(_stderr,"%s: At least one of the following required:\n",*ctx->argv);
  nn_print_requires(ctx,ctx->requires & (ctx->mask ^ 0xffffffffffffffff));
  exit(1);
}

Assistant:

void nn_check_requires (struct nn_parse_context *ctx) {
    int i;
    struct nn_option *opt;

    for (i = 0;; ++i) {
        opt = &ctx->options[i];
        if (!opt->longname)
            break;
        if (!ctx->last_option_usage[i])
            continue;
        if (opt->requires_mask &&
            (opt->requires_mask & ctx->mask) != opt->requires_mask) {
            nn_option_requires (ctx, i);
        }
    }

    if ((ctx->requires & ctx->mask) != ctx->requires) {
        fprintf (stderr, "%s: At least one of the following required:\n",
            ctx->argv[0]);
        nn_print_requires (ctx, ctx->requires & ~ctx->mask);
        exit (1);
    }
}